

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_fromUnicode_63(UConverter *cnv,char **target,char *targetLimit,UChar **source,
                        UChar *sourceLimit,int32_t *offsets,UBool flush,UErrorCode *err)

{
  UConverter *pUVar1;
  char *pcVar2;
  UBool UVar3;
  UChar *local_88;
  char *t;
  UChar *s;
  UConverterFromUnicodeArgs args;
  int32_t *offsets_local;
  UChar *sourceLimit_local;
  UChar **source_local;
  char *targetLimit_local;
  char **target_local;
  UConverter *cnv_local;
  
  if ((err != (UErrorCode *)0x0) && (args.offsets = offsets, UVar3 = U_FAILURE(*err), UVar3 == '\0')
     ) {
    if ((cnv == (UConverter *)0x0) || ((target == (char **)0x0 || (source == (UChar **)0x0)))) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      pUVar1 = (UConverter *)*source;
      pcVar2 = *target;
      if (sourceLimit < (UChar *)((long)sourceLimit + 0x7fffffffU)) {
        local_88 = (UChar *)((long)sourceLimit + 0x7fffffff);
      }
      else {
        local_88 = (UChar *)0xffffffffffffffff;
      }
      offsets_local = (int32_t *)sourceLimit;
      if (local_88 == sourceLimit) {
        offsets_local = (int32_t *)((long)sourceLimit + -1);
      }
      if ((((offsets_local < pUVar1) || (targetLimit < pcVar2)) ||
          ((0x3fffffff < (ulong)((long)offsets_local - (long)pUVar1 >> 1) &&
           (pUVar1 < offsets_local)))) ||
         (((0x7fffffff < (ulong)((long)targetLimit - (long)pcVar2) && (pcVar2 < targetLimit)) ||
          (((long)offsets_local - (long)pUVar1 & 1U) != 0)))) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else if (((cnv->charErrorBufferLength < '\x01') ||
               (UVar3 = ucnv_outputOverflowFromUnicode(cnv,target,targetLimit,&args.offsets,err),
               UVar3 == '\0')) &&
              ((flush != '\0' ||
               ((pUVar1 != (UConverter *)offsets_local || (cnv->preFromULength < '\0')))))) {
        s._2_1_ = flush;
        args.targetLimit = (char *)args.offsets;
        args.source = (UChar *)offsets_local;
        args.sourceLimit = (UChar *)*target;
        s._0_2_ = 0x38;
        args._0_8_ = cnv;
        args.converter = pUVar1;
        args.target = targetLimit;
        _fromUnicodeWithCallback((UConverterFromUnicodeArgs *)&s,err);
        *source = (UChar *)args.converter;
        *target = (char *)args.sourceLimit;
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_fromUnicode(UConverter *cnv,
                 char **target, const char *targetLimit,
                 const UChar **source, const UChar *sourceLimit,
                 int32_t *offsets,
                 UBool flush,
                 UErrorCode *err) {
    UConverterFromUnicodeArgs args;
    const UChar *s;
    char *t;

    /* check parameters */
    if(err==NULL || U_FAILURE(*err)) {
        return;
    }

    if(cnv==NULL || target==NULL || source==NULL) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    s=*source;
    t=*target;

    if ((const void *)U_MAX_PTR(sourceLimit) == (const void *)sourceLimit) {
        /*
        Prevent code from going into an infinite loop in case we do hit this
        limit. The limit pointer is expected to be on a UChar * boundary.
        This also prevents the next argument check from failing.
        */
        sourceLimit = (const UChar *)(((const char *)sourceLimit) - 1);
    }

    /*
     * All these conditions should never happen.
     *
     * 1) Make sure that the limits are >= to the address source or target
     *
     * 2) Make sure that the buffer sizes do not exceed the number range for
     * int32_t because some functions use the size (in units or bytes)
     * rather than comparing pointers, and because offsets are int32_t values.
     *
     * size_t is guaranteed to be unsigned and large enough for the job.
     *
     * Return with an error instead of adjusting the limits because we would
     * not be able to maintain the semantics that either the source must be
     * consumed or the target filled (unless an error occurs).
     * An adjustment would be targetLimit=t+0x7fffffff; for example.
     *
     * 3) Make sure that the user didn't incorrectly cast a UChar * pointer
     * to a char * pointer and provide an incomplete UChar code unit.
     */
    if (sourceLimit<s || targetLimit<t ||
        ((size_t)(sourceLimit-s)>(size_t)0x3fffffff && sourceLimit>s) ||
        ((size_t)(targetLimit-t)>(size_t)0x7fffffff && targetLimit>t) ||
        (((const char *)sourceLimit-(const char *)s) & 1) != 0)
    {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    
    /* output the target overflow buffer */
    if( cnv->charErrorBufferLength>0 &&
        ucnv_outputOverflowFromUnicode(cnv, target, targetLimit, &offsets, err)
    ) {
        /* U_BUFFER_OVERFLOW_ERROR */
        return;
    }
    /* *target may have moved, therefore stop using t */

    if(!flush && s==sourceLimit && cnv->preFromULength>=0) {
        /* the overflow buffer is emptied and there is no new input: we are done */
        return;
    }

    /*
     * Do not simply return with a buffer overflow error if
     * !flush && t==targetLimit
     * because it is possible that the source will not generate any output.
     * For example, the skip callback may be called;
     * it does not output anything.
     */

    /* prepare the converter arguments */
    args.converter=cnv;
    args.flush=flush;
    args.offsets=offsets;
    args.source=s;
    args.sourceLimit=sourceLimit;
    args.target=*target;
    args.targetLimit=targetLimit;
    args.size=sizeof(args);

    _fromUnicodeWithCallback(&args, err);

    *source=args.source;
    *target=args.target;
}